

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stonemask.cc
# Opt level: O3

void sptk::world::StoneMask
               (double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
               double *refined_f0)

{
  double initial_f0;
  bool bVar1;
  uint uVar2;
  fft_plan p;
  fft_plan p_00;
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  double *pdVar10;
  void *pvVar11;
  double *power_spectrum;
  double *numerator_i;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  fft_plan *pfVar16;
  undefined8 *puVar17;
  int iVar18;
  uint fft_size;
  int i;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  int iVar33;
  undefined8 auStackY_1c8 [5];
  undefined1 in_stack_fffffffffffffe60 [40];
  uint uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined8 in_stack_fffffffffffffe98;
  ForwardRealFFT local_98;
  
  bVar21 = 0;
  if (0 < f0_length) {
    dVar22 = (double)fs;
    uVar15 = 0;
    do {
      initial_f0 = f0[uVar15];
      dVar25 = 0.0;
      if ((40.0 < initial_f0) && (initial_f0 <= dVar22 / 12.0)) {
        dVar25 = temporal_positions[uVar15];
        dVar28 = (dVar22 * 1.5) / initial_f0 + 1.0;
        dVar23 = 0.0;
        iVar18 = (int)dVar28;
        uVar2 = iVar18 * 2;
        uVar34 = iVar18 * 2 + 1;
        uVar4 = (ulong)(int)uVar34;
        uVar19 = uVar4 * 8;
        if (iVar18 < 0) {
          uVar19 = 0xffffffffffffffff;
        }
        pvVar5 = operator_new__(uVar19);
        auVar3 = _DAT_00116930;
        if (-1 < iVar18) {
          uVar13 = 0;
          if (0 < (int)uVar2) {
            uVar13 = (ulong)uVar2;
          }
          auVar26._8_4_ = (int)uVar13;
          auVar26._0_8_ = uVar13;
          auVar26._12_4_ = 0;
          iVar12 = -iVar18;
          lVar14 = 0;
          auVar29 = _DAT_00116920;
          do {
            auVar30 = auVar26 ^ auVar3;
            auVar32 = auVar29 ^ auVar3;
            bVar1 = auVar30._0_4_ < auVar32._0_4_;
            iVar31 = auVar30._4_4_;
            iVar33 = auVar32._4_4_;
            if ((bool)(~(iVar31 < iVar33 || iVar33 == iVar31 && bVar1) & 1)) {
              *(double *)((long)pvVar5 + lVar14) = (double)iVar12 / dVar22;
            }
            if (iVar31 >= iVar33 && (iVar33 != iVar31 || !bVar1)) {
              *(double *)((long)pvVar5 + lVar14 + 8) = (double)(iVar12 + 1) / dVar22;
            }
            lVar20 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 2;
            auVar29._8_8_ = lVar20 + 2;
            lVar14 = lVar14 + 0x10;
            iVar12 = iVar12 + 2;
          } while (uVar13 * 8 + 0x10 != lVar14);
        }
        dVar27 = (double)(int)dVar23;
        dVar28 = (double)(int)dVar28 + (double)(int)dVar28 + 1.0;
        dVar23 = log(dVar28);
        dVar23 = exp2((double)(int)(dVar23 / 0.6931471805599453) + 2.0);
        fft_size = (uint)dVar23;
        local_98.forward_fft.ip = (int *)0x0;
        local_98.forward_fft.w = (double *)0x0;
        local_98.forward_fft.out = (double *)0x0;
        local_98.forward_fft.input = (double *)0x0;
        local_98.forward_fft.in = (double *)0x0;
        local_98.forward_fft.c_out = (fft_complex *)0x0;
        local_98.forward_fft.flags = 0;
        local_98.forward_fft._12_4_ = 0;
        local_98.forward_fft.c_in = (fft_complex *)0x0;
        local_98.spectrum = (fft_complex *)0x0;
        local_98.forward_fft.n = 0;
        local_98.forward_fft.sign = 0;
        local_98.fft_size = 0;
        local_98._4_4_ = 0;
        local_98.waveform = (double *)0x0;
        InitializeForwardRealFFT(fft_size,&local_98);
        uVar13 = (ulong)fft_size << 4;
        if ((int)fft_size < 0) {
          uVar13 = 0xffffffffffffffff;
        }
        pvVar6 = operator_new__(uVar13);
        pvVar7 = operator_new__(uVar13);
        uVar13 = uVar4 * 4;
        if (iVar18 < 0) {
          uVar13 = 0xffffffffffffffff;
        }
        pvVar8 = operator_new__(uVar13);
        pvVar9 = operator_new__(uVar19);
        pdVar10 = (double *)operator_new__(uVar19);
        if (iVar18 < 0) {
          *pdVar10 = NAN;
          uVar19 = (ulong)uVar34;
        }
        else {
          dVar28 = dVar28 / dVar22;
          lVar14 = (ulong)uVar2 + 1;
          lVar20 = 0;
          do {
            iVar12 = matlab_round((*(double *)((long)pvVar5 + lVar20 * 8) + dVar25) * dVar22);
            *(int *)((long)pvVar8 + lVar20 * 4) = iVar12;
            lVar20 = lVar20 + 1;
          } while (lVar14 != lVar20);
          lVar20 = 0;
          do {
            dVar23 = ((double)*(int *)((long)pvVar8 + lVar20 * 4) + -1.0) / dVar22 - dVar25;
            dVar24 = cos((dVar23 * 6.283185307179586) / dVar28);
            dVar23 = cos((dVar23 * 12.566370614359172) / dVar28);
            *(double *)((long)pvVar9 + lVar20 * 8) = dVar23 * 0.08 + dVar24 * 0.5 + 0.42;
            lVar20 = lVar20 + 1;
          } while (lVar14 != lVar20);
          *pdVar10 = *(double *)((long)pvVar9 + 8) * -0.5;
          uVar19 = uVar4;
          if (iVar18 != 0) {
            lVar14 = 0;
            do {
              pdVar10[lVar14 + 1] =
                   (*(double *)((long)pvVar9 + lVar14 * 8 + 0x10) -
                   *(double *)((long)pvVar9 + lVar14 * 8)) * -0.5;
              lVar14 = lVar14 + 1;
            } while ((ulong)uVar2 - 1 != lVar14);
          }
        }
        uVar13 = uVar19 * 4;
        pdVar10[(int)uVar2] = *(double *)((long)pvVar9 + uVar4 * 8 + -0x10) * 0.5;
        if (iVar18 < 0) {
          uVar13 = 0xffffffffffffffff;
        }
        pvVar11 = operator_new__(uVar13);
        if (-1 < iVar18) {
          uVar13 = 0;
          do {
            iVar12 = *(int *)((long)pvVar8 + uVar13 * 4) + -1;
            if (x_length + -1 < iVar12) {
              iVar12 = x_length + -1;
            }
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            *(int *)((long)pvVar11 + uVar13 * 4) = iVar12;
            uVar13 = uVar13 + 1;
          } while (uVar19 != uVar13);
          uVar13 = 0;
          do {
            local_98.waveform[uVar13] =
                 x[*(int *)((long)pvVar11 + uVar13 * 4)] * *(double *)((long)pvVar9 + uVar13 * 8);
            uVar13 = uVar13 + 1;
          } while (uVar19 != uVar13);
        }
        if ((int)uVar34 < (int)fft_size) {
          memset(local_98.waveform + uVar4,0,(ulong)((uVar2 ^ 0xfffffffe) + fft_size) * 8 + 8);
        }
        lVar14 = 9;
        pfVar16 = &local_98.forward_fft;
        puVar17 = auStackY_1c8;
        while( true ) {
          if (lVar14 == 0) break;
          lVar14 = lVar14 + -1;
          *puVar17 = *(undefined8 *)pfVar16;
          pfVar16 = (fft_plan *)((long)pfVar16 + ((ulong)bVar21 * -2 + 1) * 8);
          puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
        }
        p.out._0_4_ = SUB84(dVar28,0);
        p.n = in_stack_fffffffffffffe60._0_4_;
        p.sign = in_stack_fffffffffffffe60._4_4_;
        p.flags = in_stack_fffffffffffffe60._8_4_;
        p._12_4_ = in_stack_fffffffffffffe60._12_4_;
        p.c_in = (fft_complex *)in_stack_fffffffffffffe60._16_8_;
        p.in = (double *)in_stack_fffffffffffffe60._24_8_;
        p.c_out = (fft_complex *)in_stack_fffffffffffffe60._32_8_;
        p.out._4_4_ = (int)((ulong)dVar28 >> 0x20);
        p.input = (double *)dVar27;
        p.ip = (int *)in_stack_fffffffffffffe98;
        p.w._0_4_ = fs;
        p.w._4_4_ = uVar34;
        fft_execute(p);
        iVar12 = (int)fft_size / 2;
        uVar35 = 0;
        if (-2 < (int)fft_size) {
          lVar14 = 0;
          do {
            *(undefined8 *)((long)pvVar6 + lVar14) =
                 *(undefined8 *)((long)*local_98.spectrum + lVar14);
            *(undefined8 *)((long)pvVar6 + lVar14 + 8) =
                 *(undefined8 *)((long)*local_98.spectrum + lVar14 + 8);
            lVar14 = lVar14 + 0x10;
          } while ((ulong)(iVar12 + 1) << 4 != lVar14);
        }
        if (-1 < iVar18) {
          uVar13 = 0;
          do {
            local_98.waveform[uVar13] = x[*(int *)((long)pvVar11 + uVar13 * 4)] * pdVar10[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar19 != uVar13);
        }
        if ((int)uVar34 < (int)fft_size) {
          memset(local_98.waveform + uVar4,0,(ulong)((uVar2 ^ 0xfffffffe) + fft_size) * 8 + 8);
        }
        pfVar16 = &local_98.forward_fft;
        puVar17 = auStackY_1c8;
        for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar17 = *(undefined8 *)pfVar16;
          pfVar16 = (fft_plan *)((long)pfVar16 + ((ulong)bVar21 * -2 + 1) * 8);
          puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
        }
        p_00.out._0_4_ = iVar12;
        p_00.n = in_stack_fffffffffffffe60._0_4_;
        p_00.sign = in_stack_fffffffffffffe60._4_4_;
        p_00.flags = in_stack_fffffffffffffe60._8_4_;
        p_00._12_4_ = in_stack_fffffffffffffe60._12_4_;
        p_00.c_in = (fft_complex *)in_stack_fffffffffffffe60._16_8_;
        p_00.in = (double *)in_stack_fffffffffffffe60._24_8_;
        p_00.c_out = (fft_complex *)in_stack_fffffffffffffe60._32_8_;
        p_00.out._4_4_ = uVar35;
        p_00.input = (double *)dVar27;
        p_00.ip = (int *)in_stack_fffffffffffffe98;
        p_00.w._0_4_ = fs;
        p_00.w._4_4_ = uVar34;
        fft_execute(p_00);
        if (-2 < (int)fft_size) {
          lVar14 = 0;
          do {
            *(undefined8 *)((long)pvVar7 + lVar14) =
                 *(undefined8 *)((long)*local_98.spectrum + lVar14);
            *(undefined8 *)((long)pvVar7 + lVar14 + 8) =
                 *(undefined8 *)((long)*local_98.spectrum + lVar14 + 8);
            lVar14 = lVar14 + 0x10;
          } while ((ulong)(iVar12 + 1) << 4 != lVar14);
        }
        uVar34 = iVar12 + 1;
        operator_delete__(pvVar11);
        uVar19 = (long)(int)uVar34 << 3;
        if ((int)fft_size < -3) {
          uVar19 = 0xffffffffffffffff;
        }
        power_spectrum = (double *)operator_new__(uVar19);
        numerator_i = (double *)operator_new__(uVar19);
        if (-2 < (int)fft_size) {
          uVar19 = (ulong)uVar34;
          lVar14 = 0;
          do {
            dVar25 = *(double *)((long)pvVar6 + lVar14 * 2);
            dVar28 = *(double *)((long)pvVar6 + lVar14 * 2 + 8);
            *(double *)((long)numerator_i + lVar14) =
                 *(double *)((long)pvVar7 + lVar14 * 2 + 8) * dVar25 -
                 *(double *)((long)pvVar7 + lVar14 * 2) * dVar28;
            *(double *)((long)power_spectrum + lVar14) = dVar25 * dVar25 + dVar28 * dVar28;
            lVar14 = lVar14 + 8;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
        }
        dVar25 = anon_unknown_0::FixF0(power_spectrum,numerator_i,fft_size,fs,initial_f0,2);
        dVar28 = 0.0;
        if ((0.0 < dVar25) && (dVar25 <= initial_f0 + initial_f0)) {
          dVar28 = anon_unknown_0::FixF0(power_spectrum,numerator_i,fft_size,fs,dVar25,6);
        }
        uVar35 = SUB84(dVar28,0);
        uVar36 = (undefined4)((ulong)dVar28 >> 0x20);
        operator_delete__(pvVar7);
        operator_delete__(pdVar10);
        operator_delete__(pvVar9);
        operator_delete__(pvVar8);
        operator_delete__(numerator_i);
        operator_delete__(power_spectrum);
        operator_delete__(pvVar6);
        DestroyForwardRealFFT(&local_98);
        uVar19 = -(ulong)(initial_f0 * 0.2 < ABS((double)CONCAT44(uVar36,uVar35) - initial_f0));
        uVar19 = ~uVar19 & CONCAT44(uVar36,uVar35) | (ulong)initial_f0 & uVar19;
        uVar35 = (undefined4)uVar19;
        uVar36 = (undefined4)(uVar19 >> 0x20);
        operator_delete__(pvVar5);
        dVar25 = (double)CONCAT44(uVar36,uVar35);
      }
      refined_f0[uVar15] = dVar25;
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uint)f0_length);
  }
  return;
}

Assistant:

void StoneMask(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    double *refined_f0) {
  for (int i = 0; i < f0_length; i++)
    refined_f0[i] =
      GetRefinedF0(x, x_length, fs, temporal_positions[i], f0[i]);
}